

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

void tree_pop(tree *t)

{
  tree_entry *__ptr;
  tree_entry *te;
  tree *t_local;
  
  (t->path).s[t->dirname_length] = '\0';
  (t->path).length = t->dirname_length;
  if ((t->stack == t->current) && (t->current != (tree_entry *)0x0)) {
    t->current = t->current->parent;
  }
  __ptr = t->stack;
  t->stack = __ptr->next;
  t->dirname_length = __ptr->dirname_length;
  t->basename = (t->path).s + t->dirname_length;
  while (*t->basename == '/') {
    t->basename = t->basename + 1;
  }
  archive_string_free(&__ptr->name);
  free(__ptr);
  return;
}

Assistant:

static void
tree_pop(struct tree *t)
{
	struct tree_entry *te;

	t->path.s[t->dirname_length] = '\0';
	t->path.length = t->dirname_length;
	if (t->stack == t->current && t->current != NULL)
		t->current = t->current->parent;
	te = t->stack;
	#ifdef __clang_analyzer__
	assert(te);
	#endif
	t->stack = te->next;
	t->dirname_length = te->dirname_length;
	t->basename = t->path.s + t->dirname_length;
	while (t->basename[0] == '/')
		t->basename++;
	archive_string_free(&te->name);
	free(te);
}